

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O1

void __thiscall IRT::CFrame::CFrame(CFrame *this,string *_className,string *_methodName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  IAddress *pIVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  CTemp local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  string *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &(this->className).field_2;
  (this->className)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar3,pcVar3 + _className->_M_string_length);
  paVar2 = &(this->methodName).field_2;
  (this->methodName)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (_methodName->_M_dataplus)._M_p;
  local_98 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->methodName,pcVar3,pcVar3 + _methodName->_M_string_length);
  paVar1 = &local_c8.name.field_2;
  pcVar3 = (this->className)._M_dataplus._M_p;
  local_c8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = paVar2;
  local_a0 = &this->methodName;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,pcVar3 + (this->className)._M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c8,(ulong)(this->methodName)._M_dataplus._M_p);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar4[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  CLabel::CLabel(&this->name,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.name._M_dataplus._M_p);
  }
  (this->localVisibilityAddresses)._M_h._M_buckets =
       &(this->localVisibilityAddresses)._M_h._M_single_bucket;
  (this->localVisibilityAddresses)._M_h._M_bucket_count = 1;
  (this->localVisibilityAddresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->localVisibilityAddresses)._M_h._M_element_count = 0;
  (this->localVisibilityAddresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->localVisibilityAddresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->localVisibilityAddresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->classFieldAddresses)._M_h._M_buckets = &(this->classFieldAddresses)._M_h._M_single_bucket;
  (this->classFieldAddresses)._M_h._M_bucket_count = 1;
  (this->classFieldAddresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classFieldAddresses)._M_h._M_element_count = 0;
  (this->classFieldAddresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classFieldAddresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classFieldAddresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->maxOffsetFramePointer = 0;
  this->maxOffsetThis = 0;
  pIVar5 = (IAddress *)operator_new(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,framePointerAddressName_abi_cxx11_._M_dataplus._M_p,
             framePointerAddressName_abi_cxx11_._M_dataplus._M_p +
             framePointerAddressName_abi_cxx11_._M_string_length);
  CTemp::CTemp(&local_c8,&local_50);
  pIVar5->_vptr_IAddress = (_func_int **)&PTR__CAddressInRegister_00182f90;
  pIVar5[1]._vptr_IAddress = (_func_int **)(pIVar5 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pIVar5 + 1),local_c8.name._M_dataplus._M_p,
             local_c8.name._M_dataplus._M_p + local_c8.name._M_string_length);
  addAddress(this,&framePointerAddressName_abi_cxx11_,pIVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pIVar5 = (IAddress *)operator_new(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,returnValueAddressName_abi_cxx11_._M_dataplus._M_p,
             returnValueAddressName_abi_cxx11_._M_dataplus._M_p +
             returnValueAddressName_abi_cxx11_._M_string_length);
  CTemp::CTemp(&local_c8,&local_70);
  pIVar5->_vptr_IAddress = (_func_int **)&PTR__CAddressInRegister_00182f90;
  pIVar5[1]._vptr_IAddress = (_func_int **)(pIVar5 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pIVar5 + 1),local_c8.name._M_dataplus._M_p,
             local_c8.name._M_dataplus._M_p + local_c8.name._M_string_length);
  addAddress(this,&returnValueAddressName_abi_cxx11_,pIVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

CFrame::CFrame(const std::string &_className, const std::string &_methodName)
        : className(_className), methodName(_methodName), name(className + "$" + methodName),
          maxOffsetFramePointer(0), maxOffsetThis(0) {
    addAddress(framePointerAddressName, new CAddressInRegister(CTemp(framePointerAddressName)));
    addAddress(returnValueAddressName, new CAddressInRegister(CTemp(returnValueAddressName)));
}